

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-semaphore.c
# Opt level: O3

int run_test_semaphore_2(void)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  undefined8 *puVar3;
  uv_shutdown_t *puVar4;
  undefined8 uVar5;
  undefined8 *puVar6;
  undefined1 *puVar7;
  uv_connect_t *puVar8;
  uv_thread_t thread;
  worker_config_conflict1 wc;
  undefined1 auStack_2c0 [264];
  code *pcStack_1b8;
  code *pcStack_1b0;
  undefined1 auStack_1a0 [16];
  undefined1 auStack_190 [248];
  undefined8 *puStack_98;
  undefined8 auStack_90 [4];
  code *pcStack_70;
  undefined1 local_60 [8];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  puVar6 = &uStack_30;
  local_18 = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  uStack_10 = 100;
  pcStack_70 = (code *)0x16a250;
  iVar1 = uv_sem_init(puVar6,0);
  if (iVar1 == 0) {
    pcStack_70 = (code *)0x16a25e;
    iVar1 = uv_mutex_init(&local_58);
    if (iVar1 != 0) goto LAB_0016a2b1;
    pcStack_70 = (code *)0x16a278;
    iVar1 = uv_thread_create(local_60,worker,&local_58);
    if (iVar1 != 0) goto LAB_0016a2b6;
    pcStack_70 = (code *)0x16a284;
    uv_sem_wait(puVar6);
    pcStack_70 = (code *)0x16a28e;
    iVar1 = uv_thread_join(local_60);
    if (iVar1 == 0) {
      pcStack_70 = (code *)0x16a29c;
      uv_mutex_destroy(&local_58);
      pcStack_70 = (code *)0x16a2a4;
      uv_sem_destroy(puVar6);
      return 0;
    }
  }
  else {
    pcStack_70 = (code *)0x16a2b1;
    run_test_semaphore_2_cold_1();
LAB_0016a2b1:
    pcStack_70 = (code *)0x16a2b6;
    run_test_semaphore_2_cold_2();
LAB_0016a2b6:
    pcStack_70 = (code *)0x16a2bb;
    run_test_semaphore_2_cold_3();
  }
  pcStack_70 = run_test_semaphore_3;
  run_test_semaphore_2_cold_4();
  puVar3 = auStack_90;
  puStack_98 = (undefined8 *)0x16a2d2;
  pcStack_70 = (code *)puVar6;
  iVar1 = uv_sem_init(auStack_90,3);
  if (iVar1 == 0) {
    puStack_98 = (undefined8 *)0x16a2e1;
    uv_sem_wait(auStack_90);
    puStack_98 = (undefined8 *)0x16a2e9;
    uv_sem_wait(auStack_90);
    puStack_98 = (undefined8 *)0x16a2f1;
    iVar1 = uv_sem_trywait(auStack_90);
    puVar6 = auStack_90;
    if (iVar1 != 0) goto LAB_0016a33b;
    puStack_98 = (undefined8 *)0x16a2fd;
    iVar1 = uv_sem_trywait(auStack_90);
    puVar6 = auStack_90;
    if (iVar1 != -0xb) goto LAB_0016a340;
    puStack_98 = (undefined8 *)0x16a30d;
    uv_sem_post(auStack_90);
    puStack_98 = (undefined8 *)0x16a315;
    iVar1 = uv_sem_trywait(auStack_90);
    if (iVar1 != 0) goto LAB_0016a345;
    puStack_98 = (undefined8 *)0x16a321;
    iVar1 = uv_sem_trywait(auStack_90);
    puVar3 = auStack_90;
    if (iVar1 == -0xb) {
      puStack_98 = (undefined8 *)0x16a32e;
      uv_sem_destroy(auStack_90);
      return 0;
    }
  }
  else {
    puStack_98 = (undefined8 *)0x16a33b;
    run_test_semaphore_3_cold_1();
LAB_0016a33b:
    puStack_98 = (undefined8 *)0x16a340;
    run_test_semaphore_3_cold_2();
LAB_0016a340:
    puVar3 = puVar6;
    puStack_98 = (undefined8 *)0x16a345;
    run_test_semaphore_3_cold_3();
LAB_0016a345:
    puStack_98 = (undefined8 *)0x16a34a;
    run_test_semaphore_3_cold_4();
  }
  puStack_98 = (undefined8 *)0x16a34f;
  run_test_semaphore_3_cold_5();
  puVar8 = (uv_connect_t *)0x194b4a;
  iVar1 = 0x23a3;
  pcStack_1b0 = (code *)0x16a36e;
  puStack_98 = puVar3;
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_1a0);
  if (iVar2 == 0) {
    pcStack_1b0 = (code *)0x16a37b;
    puVar8 = (uv_connect_t *)uv_default_loop();
    iVar1 = (int)auStack_190;
    pcStack_1b0 = (code *)0x16a388;
    iVar2 = uv_tcp_init();
    if (iVar2 != 0) goto LAB_0016a423;
    puVar8 = &connect_req;
    puVar7 = auStack_190;
    pcStack_1b0 = (code *)0x16a3ad;
    iVar2 = uv_tcp_connect(&connect_req,puVar7,auStack_1a0,connect_cb);
    iVar1 = (int)puVar7;
    if (iVar2 != 0) goto LAB_0016a428;
    pcStack_1b0 = (code *)0x16a3b6;
    puVar8 = (uv_connect_t *)uv_default_loop();
    iVar1 = 0;
    pcStack_1b0 = (code *)0x16a3c0;
    iVar2 = uv_run();
    if (iVar2 != 0) goto LAB_0016a42d;
    if (connect_cb_called != 1) goto LAB_0016a432;
    if (shutdown_cb_called != 1) goto LAB_0016a437;
    if (close_cb_called != 1) goto LAB_0016a43c;
    pcStack_1b0 = (code *)0x16a3e4;
    puVar3 = (undefined8 *)uv_default_loop();
    pcStack_1b0 = (code *)0x16a3f8;
    uv_walk(puVar3,close_walk_cb,0);
    iVar1 = 0;
    pcStack_1b0 = (code *)0x16a402;
    uv_run(puVar3);
    pcStack_1b0 = (code *)0x16a407;
    puVar8 = (uv_connect_t *)uv_default_loop();
    pcStack_1b0 = (code *)0x16a40f;
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    pcStack_1b0 = (code *)0x16a423;
    run_test_shutdown_close_tcp_cold_1();
LAB_0016a423:
    pcStack_1b0 = (code *)0x16a428;
    run_test_shutdown_close_tcp_cold_2();
LAB_0016a428:
    pcStack_1b0 = (code *)0x16a42d;
    run_test_shutdown_close_tcp_cold_3();
LAB_0016a42d:
    pcStack_1b0 = (code *)0x16a432;
    run_test_shutdown_close_tcp_cold_4();
LAB_0016a432:
    pcStack_1b0 = (code *)0x16a437;
    run_test_shutdown_close_tcp_cold_5();
LAB_0016a437:
    pcStack_1b0 = (code *)0x16a43c;
    run_test_shutdown_close_tcp_cold_6();
LAB_0016a43c:
    pcStack_1b0 = (code *)0x16a441;
    run_test_shutdown_close_tcp_cold_7();
  }
  pcStack_1b0 = connect_cb;
  run_test_shutdown_close_tcp_cold_8();
  if (puVar8 == &connect_req) {
    if (iVar1 != 0) goto LAB_0016a4b6;
    pcStack_1b8 = (code *)0x16a471;
    pcStack_1b0._0_4_ = extraout_EAX;
    iVar1 = uv_shutdown(&shutdown_req,connect_req.handle,shutdown_cb);
    if (iVar1 != 0) goto LAB_0016a4bb;
    pcStack_1b8 = (code *)0x16a481;
    iVar1 = uv_is_closing(connect_req.handle);
    if (iVar1 != 0) goto LAB_0016a4c0;
    pcStack_1b8 = (code *)0x16a498;
    uv_close(connect_req.handle,close_cb);
    pcStack_1b8 = (code *)0x16a4a4;
    iVar1 = uv_is_closing(connect_req.handle);
    if (iVar1 == 1) {
      connect_cb_called = connect_cb_called + 1;
      return (int)pcStack_1b0;
    }
  }
  else {
    pcStack_1b8 = (code *)0x16a4b6;
    connect_cb_cold_1();
LAB_0016a4b6:
    pcStack_1b8 = (code *)0x16a4bb;
    connect_cb_cold_2();
LAB_0016a4bb:
    pcStack_1b8 = (code *)0x16a4c0;
    connect_cb_cold_3();
LAB_0016a4c0:
    pcStack_1b8 = (code *)0x16a4c5;
    connect_cb_cold_4();
  }
  pcStack_1b8 = run_test_shutdown_close_pipe;
  connect_cb_cold_5();
  pcStack_1b8 = (code *)puVar3;
  puVar4 = (uv_shutdown_t *)uv_default_loop();
  puVar7 = auStack_2c0;
  iVar1 = uv_pipe_init(puVar4,puVar7,0);
  iVar2 = (int)puVar7;
  if (iVar1 == 0) {
    uv_pipe_connect(&connect_req,auStack_2c0,"/tmp/uv-test-sock",connect_cb);
    puVar4 = (uv_shutdown_t *)uv_default_loop();
    iVar2 = 0;
    iVar1 = uv_run();
    if (iVar1 != 0) goto LAB_0016a57f;
    if (connect_cb_called != 1) goto LAB_0016a584;
    if (shutdown_cb_called != 1) goto LAB_0016a589;
    if (close_cb_called == 1) {
      uVar5 = uv_default_loop();
      uv_walk(uVar5,close_walk_cb,0);
      iVar2 = 0;
      uv_run(uVar5);
      puVar4 = (uv_shutdown_t *)uv_default_loop();
      iVar1 = uv_loop_close();
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0016a593;
    }
  }
  else {
    run_test_shutdown_close_pipe_cold_1();
LAB_0016a57f:
    run_test_shutdown_close_pipe_cold_2();
LAB_0016a584:
    run_test_shutdown_close_pipe_cold_3();
LAB_0016a589:
    run_test_shutdown_close_pipe_cold_4();
  }
  run_test_shutdown_close_pipe_cold_5();
LAB_0016a593:
  run_test_shutdown_close_pipe_cold_6();
  if (puVar4 == &shutdown_req) {
    if ((iVar2 == -0x7d) || (iVar2 == 0)) {
      shutdown_cb_called = shutdown_cb_called + 1;
      return extraout_EAX_00;
    }
  }
  else {
    shutdown_cb_cold_1();
  }
  shutdown_cb_cold_2();
  close_cb_called = close_cb_called + 1;
  return extraout_EAX_01;
}

Assistant:

TEST_IMPL(semaphore_2) {
  uv_thread_t thread;
  worker_config wc;

  memset(&wc, 0, sizeof(wc));
  wc.delay = 100;

  ASSERT(0 == uv_sem_init(&wc.sem, 0));
  ASSERT(0 == uv_mutex_init(&wc.mutex));
  ASSERT(0 == uv_thread_create(&thread, worker, &wc));

  uv_sem_wait(&wc.sem);

  ASSERT(0 == uv_thread_join(&thread));
  uv_mutex_destroy(&wc.mutex);
  uv_sem_destroy(&wc.sem);

  return 0;
}